

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# f2c_lite.c
# Opt level: O3

integer s_cmp(char *a0,char *b0,ftnlen la,ftnlen lb)

{
  byte *pbVar1;
  byte *pbVar2;
  uint uVar3;
  uint uVar4;
  uchar *b;
  uchar *a;
  
  pbVar1 = (byte *)(a0 + la);
  pbVar2 = (byte *)(b0 + lb);
  if (lb < la) {
    if (0 < lb) {
      do {
        uVar3 = (uint)(byte)*a0;
        uVar4 = (uint)(byte)*b0;
        if (*a0 != *b0) {
LAB_0011a047:
          return uVar3 - uVar4;
        }
        a0 = (char *)((byte *)a0 + 1);
        b0 = (char *)((byte *)b0 + 1);
      } while (b0 < pbVar2);
    }
    for (; a0 < pbVar1; a0 = (char *)((byte *)a0 + 1)) {
      if ((byte)*a0 != 0x20) {
        return (byte)*a0 - 0x20;
      }
    }
  }
  else {
    if (0 < la) {
      do {
        uVar3 = (uint)(byte)*a0;
        uVar4 = (uint)(byte)*b0;
        if (*a0 != *b0) goto LAB_0011a047;
        a0 = (char *)((byte *)a0 + 1);
        b0 = (char *)((byte *)b0 + 1);
      } while (a0 < pbVar1);
    }
    for (; b0 < pbVar2; b0 = (char *)((byte *)b0 + 1)) {
      uVar4 = (uint)(byte)*b0;
      if (*b0 != 0x20) {
        uVar3 = 0x20;
        goto LAB_0011a047;
      }
    }
  }
  return 0;
}

Assistant:

integer
s_cmp(a0, b0, la, lb)
char *a0, *b0;
ftnlen la, lb;
#else
integer
s_cmp(char *a0, char *b0, ftnlen la, ftnlen lb)
#endif
{
    register unsigned char *a, *aend, *b, *bend;
    a = (unsigned char *) a0;
    b = (unsigned char *) b0;
    aend = a + la;
    bend = b + lb;

    if (la <= lb) {
        while (a < aend)
            if (*a != *b)
                return (*a - *b);
            else {
                ++a;
                ++b;
            }

        while (b < bend)
            if (*b != ' ')
                return (' ' - *b);
            else
                ++b;
    }